

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WrittenFontCFF.cpp
# Opt level: O2

unsigned_short __thiscall
WrittenFontCFF::EncodeGlyph(WrittenFontCFF *this,uint inGlyph,ULongVector *inCharacters)

{
  pointer puVar1;
  byte inAllocatedPosition;
  iterator iVar2;
  key_type_conflict4 *__k;
  WrittenFontRepresentation *pWVar3;
  ulong uVar4;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_GlyphEncodingInfo>_>,_bool> pVar5;
  uint local_94;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_90;
  GlyphEncodingInfo local_78;
  pair<const_unsigned_int,_GlyphEncodingInfo> local_58;
  
  pWVar3 = (this->super_AbstractWrittenFont).mANSIRepresentation;
  local_94 = inGlyph;
  if ((pWVar3->mGlyphIDToEncodedChar)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    GlyphEncodingInfo::GlyphEncodingInfo(&local_78,0,0);
    local_58.first = 0;
    local_58.second.mEncodedCharacter = local_78.mEncodedCharacter;
    local_58.second.mUnicodeCharacters.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_78.mUnicodeCharacters.
         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_58.second.mUnicodeCharacters.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_78.mUnicodeCharacters.
         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_58.second.mUnicodeCharacters.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_78.mUnicodeCharacters.
         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_78.mUnicodeCharacters.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.mUnicodeCharacters.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78.mUnicodeCharacters.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    _Rb_tree<unsigned_int,std::pair<unsigned_int_const,GlyphEncodingInfo>,std::_Select1st<std::pair<unsigned_int_const,GlyphEncodingInfo>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,GlyphEncodingInfo>>>
    ::_M_insert_unique<std::pair<unsigned_int_const,GlyphEncodingInfo>>
              ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,GlyphEncodingInfo>,std::_Select1st<std::pair<unsigned_int_const,GlyphEncodingInfo>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,GlyphEncodingInfo>>>
                *)pWVar3,&local_58);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&local_58.second.mUnicodeCharacters.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&local_78.mUnicodeCharacters.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    RemoveFromFreeList(this,'\0');
    this->mAssignedPositions[0] = 0;
    this->mAssignedPositionsAvailable[0] = false;
    pWVar3 = (this->super_AbstractWrittenFont).mANSIRepresentation;
  }
  __k = &local_94;
  iVar2 = std::
          _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_GlyphEncodingInfo>,_std::_Select1st<std::pair<const_unsigned_int,_GlyphEncodingInfo>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_GlyphEncodingInfo>_>_>
          ::find((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_GlyphEncodingInfo>,_std::_Select1st<std::pair<const_unsigned_int,_GlyphEncodingInfo>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_GlyphEncodingInfo>_>_>
                  *)pWVar3,__k);
  if ((_Rb_tree_header *)iVar2._M_node ==
      &(((this->super_AbstractWrittenFont).mANSIRepresentation)->mGlyphIDToEncodedChar)._M_t._M_impl
       .super__Rb_tree_header) {
    puVar1 = (inCharacters->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    if (puVar1 == (inCharacters->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_start) {
      inAllocatedPosition = (byte)local_94;
    }
    else {
      inAllocatedPosition = (byte)puVar1[-1];
    }
    uVar4 = (ulong)inAllocatedPosition;
    if (this->mAssignedPositionsAvailable[uVar4] == true) {
      RemoveFromFreeList(this,inAllocatedPosition);
    }
    else {
      inAllocatedPosition = AllocateFromFreeList(this,(uint)__k);
      uVar4 = (ulong)inAllocatedPosition;
    }
    this->mAssignedPositions[uVar4] = local_94;
    this->mAssignedPositionsAvailable[uVar4] = false;
    pWVar3 = (this->super_AbstractWrittenFont).mANSIRepresentation;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_90,inCharacters);
    GlyphEncodingInfo::GlyphEncodingInfo
              (&local_78,(ushort)inAllocatedPosition,(ULongVector *)&local_90);
    local_58.first = local_94;
    local_58.second.mEncodedCharacter = local_78.mEncodedCharacter;
    local_58.second.mUnicodeCharacters.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_78.mUnicodeCharacters.
         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_58.second.mUnicodeCharacters.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_78.mUnicodeCharacters.
         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_58.second.mUnicodeCharacters.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_78.mUnicodeCharacters.
         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_78.mUnicodeCharacters.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.mUnicodeCharacters.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78.mUnicodeCharacters.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pVar5 = std::
            _Rb_tree<unsigned_int,std::pair<unsigned_int_const,GlyphEncodingInfo>,std::_Select1st<std::pair<unsigned_int_const,GlyphEncodingInfo>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,GlyphEncodingInfo>>>
            ::_M_insert_unique<std::pair<unsigned_int_const,GlyphEncodingInfo>>
                      ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,GlyphEncodingInfo>,std::_Select1st<std::pair<unsigned_int_const,GlyphEncodingInfo>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,GlyphEncodingInfo>>>
                        *)pWVar3,&local_58);
    iVar2._M_node = (_Base_ptr)pVar5.first._M_node;
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&local_58.second.mUnicodeCharacters.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&local_78.mUnicodeCharacters.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_90);
    this->mAvailablePositionsCount = this->mAvailablePositionsCount + 0xff;
  }
  return *(unsigned_short *)&iVar2._M_node[1]._M_parent;
}

Assistant:

unsigned short WrittenFontCFF::EncodeGlyph(unsigned int inGlyph,const ULongVector& inCharacters)
{
	// for the first time, add also 0,0 mapping
	if(mANSIRepresentation->mGlyphIDToEncodedChar.size() == 0)
	{
		mANSIRepresentation->mGlyphIDToEncodedChar.insert(UIntToGlyphEncodingInfoMap::value_type(0,GlyphEncodingInfo(0,0)));
		RemoveFromFreeList(0);
		mAssignedPositions[0] = 0;
		mAssignedPositionsAvailable[0] = false;
	}

	UIntToGlyphEncodingInfoMap::iterator it = mANSIRepresentation->mGlyphIDToEncodedChar.find(inGlyph);

	if(it == mANSIRepresentation->mGlyphIDToEncodedChar.end())
	{
		// as a default position, i'm grabbing the ansi bits. this should display nice charachters, when possible
		unsigned char encoding;
		if(inCharacters.size() > 0)
			encoding = (unsigned char)(inCharacters.back() & 0xff);
		else
			encoding = (unsigned char)(inGlyph & 0xff);
		if(mAssignedPositionsAvailable[encoding])
			RemoveFromFreeList(encoding);
		else
			encoding = AllocateFromFreeList(inGlyph);
		mAssignedPositions[encoding] = inGlyph;
		mAssignedPositionsAvailable[encoding] = false;
		it = mANSIRepresentation->mGlyphIDToEncodedChar.insert(
				UIntToGlyphEncodingInfoMap::value_type(inGlyph,GlyphEncodingInfo(encoding,inCharacters))).first;			
		--mAvailablePositionsCount;
	}
	return it->second.mEncodedCharacter;
}